

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O1

bool EOPlus::check_op(char a,char b)

{
  undefined3 in_register_00000039;
  bool bVar1;
  
  bVar1 = false;
  switch(CONCAT31(in_register_00000039,a)) {
  case 0x21:
  case 0x3c:
  case 0x3e:
    bVar1 = b == '=';
    goto LAB_0013bf1d;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x27:
  case 0x2c:
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
    break;
  case 0x25:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2f:
    bVar1 = b == '\0';
    break;
  case 0x26:
    bVar1 = b == '&';
    goto LAB_0013bf1d;
  case 0x2d:
    bVar1 = (b & 0xfdU) == 0;
    break;
  case 0x3d:
    bVar1 = b == '=';
    break;
  default:
    if (CONCAT31(in_register_00000039,a) != 0x7c) {
      return false;
    }
    bVar1 = b == '|';
LAB_0013bf1d:
    return (bool)(bVar1 | b == '\0');
  }
  return bVar1;
}

Assistant:

bool check_op(char a, char b)
	{
		switch (a)
		{
			case '(': case ')': case '+': return b == '\0';
			case '&': return b == '\0' || b == '&';
			case '|': return b == '\0' || b == '|';
			case '-': return b == '\0' || b == UOP_ALT;
			case '*': case '/': case '%': return b == '\0';
			case '<': case '>': case '!': return b == '\0' || b == '=';
			case '=': return b == '=';
			default: return false;
		}
	}